

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O3

Aig_Obj_t * Cgt_ManBuildClockGate(Aig_Man_t *pNew,Vec_Ptr_t *vGates)

{
  Aig_Obj_t *p0;
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  
  if (0 < vGates->nSize) {
    p0 = (Aig_Obj_t *)((ulong)pNew->pConst1 ^ 1);
    lVar3 = 0;
    do {
      puVar2 = (ulong *)((ulong)vGates->pArray[lVar3] & 0xfffffffffffffffe);
      uVar1 = *puVar2;
      if (uVar1 == 0) {
        uVar1 = puVar2[5];
      }
      p0 = Aig_Or(pNew,p0,(Aig_Obj_t *)((uint)vGates->pArray[lVar3] & 1 ^ uVar1));
      lVar3 = lVar3 + 1;
    } while (lVar3 < vGates->nSize);
    return p0;
  }
  __assert_fail("Vec_PtrSize(vGates) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                ,500,"Aig_Obj_t *Cgt_ManBuildClockGate(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Aig_Obj_t * Cgt_ManBuildClockGate( Aig_Man_t * pNew, Vec_Ptr_t * vGates )
{
    Aig_Obj_t * pGate, * pTotal;
    int i;
    assert( Vec_PtrSize(vGates) > 0 );
    pTotal = Aig_ManConst0(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vGates, pGate, i )
    {
        if ( Aig_Regular(pGate)->pNext )
            pGate = Aig_NotCond( Aig_Regular(pGate)->pNext, Aig_IsComplement(pGate) );
        else
            pGate = Aig_NotCond( (Aig_Obj_t *)Aig_Regular(pGate)->pData, Aig_IsComplement(pGate) );
        pTotal = Aig_Or( pNew, pTotal, pGate );
    }
    return pTotal;
}